

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

int __thiscall kj::anon_unknown_8::DiskHandle::stat(DiskHandle *this,char *__file,stat *__buf)

{
  int iVar1;
  Fault f;
  stat stats;
  Fault local_b0;
  stat local_a8;
  
  do {
    iVar1 = fstat(*(int *)__file,(stat *)&local_a8);
    if (-1 < iVar1) goto LAB_004c012c;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x131,iVar1,"::fstat(fd, &stats)","");
    kj::_::Debug::Fault::fatal(&local_b0);
  }
LAB_004c012c:
  statToMetadata((Metadata *)this,&local_a8);
  return (int)this;
}

Assistant:

FsNode::Metadata stat() const {
    struct stat stats;
    KJ_SYSCALL(::fstat(fd, &stats));
    return statToMetadata(stats);
  }